

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O2

String * __thiscall
Diligent::GetLayoutElementString_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,LayoutElement *Element)

{
  ostream *poVar1;
  Char *pCVar2;
  char *pcVar3;
  stringstream ss;
  allocator local_1f2;
  allocator local_1f1;
  string local_1f0;
  string local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar1 = std::operator<<(local_1a0,"HLSLSemantic: ");
  poVar1 = std::operator<<(poVar1,*(char **)this);
  poVar1 = std::operator<<(poVar1,", InputIndex: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,", BufferSlot: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,", NumComponents: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,", ValueType: ");
  pCVar2 = GetValueTypeString((VALUE_TYPE)this[0x14]);
  poVar1 = std::operator<<(poVar1,pCVar2);
  poVar1 = std::operator<<(poVar1,", IsNormalized: ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  poVar1 = std::operator<<(poVar1,", RelativeOffset: ");
  if (*(uint *)(this + 0x18) == 0xffffffff) {
    std::__cxx11::string::string((string *)&local_1d0,"auto",&local_1f1);
  }
  else {
    std::__cxx11::to_string(&local_1d0,*(uint *)(this + 0x18));
  }
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,", Stride: ");
  if (*(uint *)(this + 0x1c) == 0xffffffff) {
    std::__cxx11::string::string((string *)&local_1f0,"auto",&local_1f2);
  }
  else {
    std::__cxx11::to_string(&local_1f0,*(uint *)(this + 0x1c));
  }
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,", Frequency: ");
  pcVar3 = GetInputElementFrequencyString((INPUT_ELEMENT_FREQUENCY)this[0x20]);
  poVar1 = std::operator<<(poVar1,pcVar3);
  poVar1 = std::operator<<(poVar1,", InstanceDataStepRate: ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

String GetLayoutElementString(const LayoutElement& Element)
{
    std::stringstream ss;
    ss << "HLSLSemantic: " << Element.HLSLSemantic
       << ", InputIndex: " << Element.InputIndex
       << ", BufferSlot: " << Element.BufferSlot
       << ", NumComponents: " << Element.NumComponents
       << ", ValueType: " << GetValueTypeString(Element.ValueType)
       << ", IsNormalized: " << Element.IsNormalized
       << ", RelativeOffset: " << (Element.RelativeOffset == LAYOUT_ELEMENT_AUTO_OFFSET ? "auto" : std::to_string(Element.RelativeOffset))
       << ", Stride: " << (Element.Stride == LAYOUT_ELEMENT_AUTO_STRIDE ? "auto" : std::to_string(Element.Stride))
       << ", Frequency: " << GetInputElementFrequencyString(Element.Frequency)
       << ", InstanceDataStepRate: " << Element.InstanceDataStepRate;

    return ss.str();
}